

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageChannel.cpp
# Opt level: O3

void __thiscall Imf_3_2::ImageChannel::boundsCheck(ImageChannel *this,int x,int y)

{
  ImageLevel *pIVar1;
  ostream *poVar2;
  ArgExc *pAVar3;
  stringstream _iex_throw_s;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  pIVar1 = this->_level;
  if (((((pIVar1->_dataWindow).min.x <= x) && (x <= (pIVar1->_dataWindow).max.x)) &&
      ((pIVar1->_dataWindow).min.y <= y)) && (y <= (pIVar1->_dataWindow).max.y)) {
    if ((x % this->_xSampling == 0) && (y % this->_ySampling == 0)) {
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(asStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"Attempt to access a pixel at location (",0x27);
    poVar2 = (ostream *)std::ostream::operator<<(local_198,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,") in a channel whose x and y sampling rates are ",0x30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_xSampling);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," and ",5);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_ySampling);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,".  The pixel coordinates are not divisible by the sampling rates.",0x41);
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar3,asStack_1a8);
    __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Attempt to access a pixel at location (",0x27);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,") in an image whose data window is (",0x24);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).min.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).min.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - (",5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).max.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).max.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,").",2);
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar3,asStack_1a8);
  __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageChannel::boundsCheck (int x, int y) const
{
    const Box2i& dataWindow = level ().dataWindow ();

    if (x < dataWindow.min.x || x > dataWindow.max.x || y < dataWindow.min.y ||
        y > dataWindow.max.y)
    {
        THROW (
            ArgExc,
            "Attempt to access a pixel at location "
            "(" << x
                << ", " << y
                << ") in an image whose data window is "
                   "("
                << dataWindow.min.x << ", " << dataWindow.min.y
                << ") - "
                   "("
                << dataWindow.max.x << ", " << dataWindow.max.y << ").");
    }

    if (x % _xSampling || y % _ySampling)
    {
        THROW (
            ArgExc,
            "Attempt to access a pixel at location "
            "(" << x
                << ", " << y
                << ") in a channel whose x and y sampling "
                   "rates are "
                << _xSampling << " and " << _ySampling
                << ".  The "
                   "pixel coordinates are not divisible by the sampling rates.");
    }
}